

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O2

void __thiscall
pstack::Procman::LiveProcess::LiveProcess
          (LiveProcess *this,Context *context,sptr *ex,pid_t pid_,bool alreadyStopped)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  string local_c8 [32];
  string local_a8 [32];
  sptr local_88;
  shared_ptr<pstack::Procman::LiveReader> local_78;
  Context local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_40;
  char local_38 [4];
  allocator<char> local_31;
  pid_t pid__local;
  
  local_40 = (ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (char  [4])pid_;
  if (local_40 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"exe",&local_31);
    pstack::Context::procname((int)local_c8,(string *)context);
    pstack::Context::getImageForName((string *)&local_50,SUB81(context,0));
  }
  else {
    std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::make_shared<pstack::Procman::LiveReader,pstack::Context&,int&,char_const(&)[4]>
            (local_60,(int *)context,&local_38);
  std::make_shared<pstack::CacheReader,std::shared_ptr<pstack::Procman::LiveReader>>(&local_78);
  local_88.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_78.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_78.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_78.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::Process(&this->super_Process,context,(sptr *)&local_50,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (local_40 == (element_type *)0x0) {
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
  }
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_00151288;
  this->pid = (pid_t)local_38;
  p_Var1 = &(this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ps_getpid((ps_prochandle *)this);
  if (alreadyStopped) {
    pmVar2 = std::
             map<int,_pstack::Procman::LiveProcess::Lwp,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Procman::LiveProcess::Lwp>_>_>
             ::operator[](&this->stoppedLWPs,&this->pid);
    pmVar2->stopCount = 1;
  }
  return;
}

Assistant:

LiveProcess::LiveProcess(Context &context, Elf::Object::sptr &ex, pid_t pid_, bool alreadyStopped)
    : Process(
            context,
            ex ? ex : context.getImageForName(context.procname(pid_, "exe")),
            std::make_shared<CacheReader>(std::make_shared<LiveReader>(context, pid_, "mem")))
    , pid(pid_)
{
    (void)ps_getpid(this);
    if (alreadyStopped)
       stoppedLWPs[pid].stopCount = 1;
}